

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall QtPrivate::QCalendarModel::setMaximumDate(QCalendarModel *this,QDate d)

{
  long in_FS_OFFSET;
  QArrayDataPointer<int> QStack_88;
  undefined1 *puStack_68;
  undefined1 *puStack_60;
  undefined1 *puStack_58;
  undefined1 *puStack_48;
  undefined1 *puStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_38;
  long lStack_28;
  
  if ((0x16d3e147973 < d.jd + 0xb69eeff91fU) || ((this->m_maximumDate).jd == d.jd)) {
    return;
  }
  (this->m_maximumDate).jd = d.jd;
  if (d.jd < (this->m_minimumDate).jd) {
    (this->m_minimumDate).jd = d.jd;
  }
  if (d.jd < (this->m_date).jd) {
    (this->m_date).jd = d.jd;
    internalUpdate(this);
    return;
  }
  lStack_28 = *(long *)(in_FS_OFFSET + 0x28);
  tStack_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_68 = (undefined1 *)0xffffffffffffffff;
  puStack_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = (undefined1 *)0x0;
  puStack_58 = (undefined1 *)0x0;
  (**(code **)(*(long *)this + 0x60))((QModelIndex *)&puStack_48,this,0,0,&puStack_68);
  puStack_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QStack_88.d = (Data *)0xffffffffffffffff;
  QStack_88.ptr = (int *)0x0;
  QStack_88.size = 0;
  (**(code **)(*(long *)this + 0x60))
            (&puStack_68,this,this->m_firstRow + 5,this->m_firstColumn + 6,&QStack_88);
  QStack_88.d = (Data *)0x0;
  QStack_88.ptr = (int *)0x0;
  QStack_88.size = 0;
  QAbstractItemModel::dataChanged
            ((QModelIndex *)this,(QModelIndex *)&puStack_48,(QList_conflict *)&puStack_68);
  QArrayDataPointer<int>::~QArrayDataPointer(&QStack_88);
  QAbstractItemModel::headerDataChanged((Orientation)this,2,0);
  QAbstractItemModel::headerDataChanged((Orientation)this,1,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lStack_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarModel::setMaximumDate(QDate d)
{
    if (!d.isValid() || d == m_maximumDate)
        return;

    m_maximumDate = d;
    if (m_minimumDate > m_maximumDate)
        m_minimumDate = m_maximumDate;
    if (m_date > m_maximumDate)
        m_date = m_maximumDate;
    internalUpdate();
}